

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# win_helper.c
# Opt level: O3

void cpu_gl_switch_gregs_sparc64(CPUSPARCState_conflict1 *env,uint32_t new_gl)

{
  target_ulong tVar1;
  uint64_t uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = (new_gl & 7) << 3;
  uVar3 = (env->gl & 7) << 3;
  if (uVar4 != uVar3) {
    tVar1 = env->gregs[1];
    env->glregs[uVar3] = env->gregs[0];
    (env->glregs + uVar3)[1] = tVar1;
    tVar1 = env->gregs[3];
    env->glregs[(ulong)uVar3 + 2] = env->gregs[2];
    (env->glregs + (ulong)uVar3 + 2)[1] = tVar1;
    tVar1 = env->gregs[5];
    env->glregs[(ulong)uVar3 + 4] = env->gregs[4];
    (env->glregs + (ulong)uVar3 + 4)[1] = tVar1;
    tVar1 = env->gregs[7];
    env->glregs[(ulong)uVar3 + 6] = env->gregs[6];
    (env->glregs + (ulong)uVar3 + 6)[1] = tVar1;
    uVar2 = (env->glregs + uVar4)[1];
    env->gregs[0] = env->glregs[uVar4];
    env->gregs[1] = uVar2;
    uVar2 = (env->glregs + (ulong)uVar4 + 2)[1];
    env->gregs[2] = env->glregs[(ulong)uVar4 + 2];
    env->gregs[3] = uVar2;
    uVar2 = (env->glregs + (ulong)uVar4 + 4)[1];
    env->gregs[4] = env->glregs[(ulong)uVar4 + 4];
    env->gregs[5] = uVar2;
    uVar2 = (env->glregs + (ulong)uVar4 + 6)[1];
    env->gregs[6] = env->glregs[(ulong)uVar4 + 6];
    env->gregs[7] = uVar2;
  }
  return;
}

Assistant:

static inline uint64_t *get_gl_gregset(CPUSPARCState *env, uint32_t gl)
{
    return env->glregs + (gl & 7) * 8;
}